

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

CoverpointSymbol * slang::ast::CoverpointSymbol::fromSyntax(Scope *scope,CoverpointSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  Type *newType;
  SyntaxNode *this;
  IdentifierNameSyntax *pIVar2;
  DataTypeSyntax *newType_00;
  ExpressionSyntax *pEVar3;
  reference ppMVar4;
  SyntaxNode *in_RSI;
  OptionBuilder *in_RDI;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> sVar5;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  OptionBuilder options;
  CoverpointSymbol *result;
  Token id;
  SourceLocation loc;
  string_view name;
  SyntaxNode *in_stack_00000308;
  Scope *in_stack_00000310;
  CoverpointSymbol *result_1;
  Compilation *comp;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffca8;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  *in_stack_fffffffffffffcb0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffcb8;
  OptionBuilder *in_stack_fffffffffffffcc0;
  SourceLocation *in_stack_fffffffffffffcc8;
  CoverpointSymbol *scope_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcd0;
  Compilation *in_stack_fffffffffffffcd8;
  DeclaredType *pDVar6;
  Symbol *in_stack_fffffffffffffce0;
  pointer in_stack_fffffffffffffce8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffcf0;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_2c8;
  SyntaxNode *local_2c0;
  CoverageOptionSyntax *in_stack_fffffffffffffd80;
  OptionBuilder *in_stack_fffffffffffffd88;
  Token local_f0;
  SourceLocation local_e0;
  CoverpointSymbol *local_c8;
  Token local_c0;
  SourceLocation local_b0;
  SourceLocation local_a8;
  string_view local_a0;
  Token local_90;
  SourceLocation local_80;
  string_view local_78;
  SourceLocation local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  Token local_50;
  SourceLocation local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  CoverpointSymbol *local_28;
  Compilation *local_20;
  SyntaxNode *local_18;
  OptionBuilder *local_10;
  CoverpointSymbol *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = Scope::getCompilation((Scope *)in_RDI);
  bVar1 = parsing::Token::isMissing((Token *)(local_18 + 4));
  if (bVar1) {
    local_38 = sv((char *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
    local_50 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffce0);
    local_40 = parsing::Token::location(&local_50);
    local_28 = BumpAllocator::
               emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         ((BumpAllocator *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                          in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    pDVar6 = &local_28->declaredType;
    newType = Compilation::getErrorType(local_20);
    DeclaredType::setType(pDVar6,newType);
    local_8 = local_28;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60);
    SourceLocation::SourceLocation(&local_68);
    if (local_18[3].previewNode == (SyntaxNode *)0x0) {
      pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d430a);
      if ((pEVar3->super_SyntaxNode).kind == IdentifierName) {
        this = &not_null<slang::syntax::ExpressionSyntax_*>::operator->
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d4327)->
                super_SyntaxNode;
        pIVar2 = slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(this);
        local_90.kind = (pIVar2->identifier).kind;
        local_90._2_1_ = (pIVar2->identifier).field_0x2;
        local_90.numFlags.raw = (pIVar2->identifier).numFlags.raw;
        local_90.rawLen = (pIVar2->identifier).rawLen;
        local_90.info = (pIVar2->identifier).info;
        local_a0 = parsing::Token::valueText((Token *)in_stack_fffffffffffffcc0);
        local_60._M_len = local_a0._M_len;
        local_60._M_str = local_a0._M_str;
        local_a8 = parsing::Token::location(&local_90);
        local_68 = local_a8;
      }
      else {
        not_null<slang::syntax::ExpressionSyntax_*>::operator->
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d43bc);
        local_c0 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffce0)
        ;
        local_b0 = parsing::Token::location(&local_c0);
        local_68 = local_b0;
      }
    }
    else {
      local_78 = parsing::Token::valueText((Token *)in_stack_fffffffffffffcc0);
      local_60._M_len = local_78._M_len;
      local_60._M_str = local_78._M_str;
      local_80 = parsing::Token::location((Token *)(local_18[3].previewNode + 1));
      local_68 = local_80;
    }
    local_c8 = BumpAllocator::
               emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
                         ((BumpAllocator *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                          in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    Symbol::setSyntax(&local_c8->super_Symbol,local_18);
    scope_00 = local_c8;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffcf0._M_extent_value;
    syntax_00._M_ptr = in_stack_fffffffffffffce8;
    Symbol::setAttributes(in_stack_fffffffffffffce0,(Scope *)in_stack_fffffffffffffcd8,syntax_00);
    pDVar6 = &local_c8->declaredType;
    newType_00 = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                           ((not_null<slang::syntax::DataTypeSyntax_*> *)0x6d44b1);
    DeclaredType::setTypeSyntax(pDVar6,newType_00);
    pDVar6 = &local_c8->declaredType;
    pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d44e0);
    not_null<slang::syntax::ExpressionSyntax_*>::operator->
              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d44f6);
    local_f0 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pDVar6);
    local_e0 = parsing::Token::location(&local_f0);
    DeclaredType::setInitializerSyntax(pDVar6,pEVar3,local_e0);
    anon_unknown.dwarf_ede7fa::OptionBuilder::OptionBuilder(local_10,(Scope *)scope_00);
    local_2c0 = local_18 + 6;
    local_2c8._M_current =
         (MemberSyntax **)
         std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                   (in_stack_fffffffffffffca8);
    std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
              ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
               in_stack_fffffffffffffcb8);
    while (bVar1 = __gnu_cxx::
                   operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             (in_stack_fffffffffffffcb0,
                              (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffca8), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppMVar4 = __gnu_cxx::
                __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                ::operator*(&local_2c8);
      if (((*ppMVar4)->super_SyntaxNode).kind == CoverageOption) {
        in_stack_fffffffffffffcc0 =
             (OptionBuilder *)
             slang::syntax::SyntaxNode::as<slang::syntax::CoverageOptionSyntax>
                       (&(*ppMVar4)->super_SyntaxNode);
        anon_unknown.dwarf_ede7fa::OptionBuilder::add
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      }
      else {
        Scope::addMembers(in_stack_00000310,in_stack_00000308);
      }
      __gnu_cxx::
      __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
      ::operator++(&local_2c8);
    }
    sVar5 = anon_unknown.dwarf_ede7fa::OptionBuilder::get(in_stack_fffffffffffffcc0);
    local_c8->options = sVar5;
    local_8 = local_c8;
    anon_unknown.dwarf_ede7fa::OptionBuilder::~OptionBuilder
              ((OptionBuilder *)sVar5._M_extent._M_extent_value._M_extent_value);
  }
  return local_8;
}

Assistant:

CoverpointSymbol& CoverpointSymbol::fromSyntax(const Scope& scope, const CoverpointSyntax& syntax) {
    // It's possible for invalid syntax to parse as a coverpoint. If the keyword wasn't
    // given just give up and return a placeholder.
    auto& comp = scope.getCompilation();
    if (syntax.coverpoint.isMissing()) {
        auto result = comp.emplace<CoverpointSymbol>(comp, ""sv, syntax.getFirstToken().location());
        result->declaredType.setType(comp.getErrorType());
        return *result;
    }

    // Figure out the name of the coverpoint. If there's a label, it provides the name.
    // Otherwise check if the expression is a simple variable reference. If so, we take
    // that variable name as the name of the coverpoint. Otherwise it's unnamed.
    std::string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else if (syntax.expr->kind == SyntaxKind::IdentifierName) {
        auto id = syntax.expr->as<IdentifierNameSyntax>().identifier;
        name = id.valueText();
        loc = id.location();
    }
    else {
        loc = syntax.expr->getFirstToken().location();
    }

    auto result = comp.emplace<CoverpointSymbol>(comp, name, loc);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    result->declaredType.setTypeSyntax(*syntax.type);
    result->declaredType.setInitializerSyntax(*syntax.expr,
                                              syntax.expr->getFirstToken().location());

    OptionBuilder options(*result);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            options.add(member->as<CoverageOptionSyntax>());
        else
            result->addMembers(*member);
    }

    result->options = options.get();
    return *result;
}